

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int getevents(int s,int events,int timeout)

{
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  timeval *local_100;
  fd_set *__arr;
  uint __i;
  int revents;
  timeval tv;
  size_t fdsz;
  int local_a0;
  int maxfd;
  int sndfd;
  int rcvfd;
  fd_set pollset;
  int rc;
  int timeout_local;
  int events_local;
  int s_local;
  
  fdsz._4_4_ = 0;
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    (&sndfd + (ulong)(uint)__arr * 2)[0] = 0;
    (&sndfd + (ulong)(uint)__arr * 2)[1] = 0;
  }
  pollset.fds_bits[0xf]._4_4_ = timeout;
  if ((events & 1U) != 0) {
    tv.tv_usec = 4;
    pollset.fds_bits[0xf]._0_4_ = nn_getsockopt(s,0,0xb,&maxfd,&tv.tv_usec);
    if ((int)pollset.fds_bits[0xf] != 0) {
      nn_backtrace_print();
      pFVar1 = _stderr;
      piVar2 = __errno_location();
      pcVar3 = nn_err_strerror(*piVar2);
      puVar4 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/poll.c",
              0x52);
      fflush(_stderr);
      nn_err_abort();
    }
    if (tv.tv_usec != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","fdsz == sizeof (rcvfd)",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/poll.c",
              0x53);
      fflush(_stderr);
      nn_err_abort();
    }
    *(ulong *)(&sndfd + (long)(maxfd / 0x40) * 2) =
         1L << ((byte)((long)maxfd % 0x40) & 0x3f) | *(ulong *)(&sndfd + (long)(maxfd / 0x40) * 2);
    if (0 < maxfd + 1) {
      fdsz._4_4_ = maxfd + 1;
    }
  }
  if ((events & 2U) != 0) {
    tv.tv_usec = 4;
    pollset.fds_bits[0xf]._0_4_ = nn_getsockopt(s,0,10,&local_a0,&tv.tv_usec);
    if ((int)pollset.fds_bits[0xf] != 0) {
      nn_backtrace_print();
      pFVar1 = _stderr;
      piVar2 = __errno_location();
      pcVar3 = nn_err_strerror(*piVar2);
      puVar4 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/poll.c",
              0x5e);
      fflush(_stderr);
      nn_err_abort();
    }
    if (tv.tv_usec != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","fdsz == sizeof (sndfd)",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/poll.c",
              0x5f);
      fflush(_stderr);
      nn_err_abort();
    }
    *(ulong *)(&sndfd + (long)(local_a0 / 0x40) * 2) =
         1L << ((byte)((long)local_a0 % 0x40) & 0x3f) |
         *(ulong *)(&sndfd + (long)(local_a0 / 0x40) * 2);
    if (fdsz._4_4_ < local_a0 + 1) {
      fdsz._4_4_ = local_a0 + 1;
    }
  }
  if (pollset.fds_bits[0xf]._4_4_ < 0) {
    local_100 = (timeval *)0x0;
  }
  else {
    ___i = (long)(pollset.fds_bits[0xf]._4_4_ / 1000);
    tv.tv_sec = (__time_t)((pollset.fds_bits[0xf]._4_4_ % 1000) * 1000);
    local_100 = (timeval *)&__i;
  }
  pollset.fds_bits[0xf]._0_4_ =
       select(fdsz._4_4_,(fd_set *)&sndfd,(fd_set *)0x0,(fd_set *)0x0,local_100);
  if ((int)pollset.fds_bits[0xf] < 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/poll.c",0x70)
    ;
    fflush(_stderr);
    nn_err_abort();
  }
  __arr._4_4_ = 0;
  if (((events & 1U) != 0) &&
     ((*(ulong *)(&sndfd + (long)(maxfd / 0x40) * 2) & 1L << ((byte)((long)maxfd % 0x40) & 0x3f)) !=
      0)) {
    __arr._4_4_ = 1;
  }
  if (((events & 2U) != 0) &&
     ((*(ulong *)(&sndfd + (long)(local_a0 / 0x40) * 2) &
      1L << ((byte)((long)local_a0 % 0x40) & 0x3f)) != 0)) {
    __arr._4_4_ = __arr._4_4_ | 2;
  }
  return __arr._4_4_;
}

Assistant:

int getevents (int s, int events, int timeout)
{
    int rc;
    fd_set pollset;
#if defined NN_HAVE_WINDOWS
    SOCKET rcvfd;
    SOCKET sndfd;
#else
    int rcvfd;
    int sndfd;
    int maxfd;
#endif
    size_t fdsz;
    struct timeval tv;
    int revents;

#if !defined NN_HAVE_WINDOWS
    maxfd = 0;
#endif
    FD_ZERO (&pollset);

    if (events & NN_IN) {
        fdsz = sizeof (rcvfd);
        rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_RCVFD, (char*) &rcvfd, &fdsz);
        errno_assert (rc == 0);
        nn_assert (fdsz == sizeof (rcvfd));
        FD_SET (rcvfd, &pollset);
#if !defined NN_HAVE_WINDOWS
        if (rcvfd + 1 > maxfd)
            maxfd = rcvfd + 1;
#endif
    }

    if (events & NN_OUT) {
        fdsz = sizeof (sndfd);
        rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_SNDFD, (char*) &sndfd, &fdsz);
        errno_assert (rc == 0);
        nn_assert (fdsz == sizeof (sndfd));
        FD_SET (sndfd, &pollset);
#if !defined NN_HAVE_WINDOWS
        if (sndfd + 1 > maxfd)
            maxfd = sndfd + 1;
#endif
    }

    if (timeout >= 0) {
        tv.tv_sec = timeout / 1000;
        tv.tv_usec = (timeout % 1000) * 1000;
    }
#if defined NN_HAVE_WINDOWS
    rc = select (0, &pollset, NULL, NULL, timeout < 0 ? NULL : &tv);
    wsa_assert (rc != SOCKET_ERROR);
#else
    rc = select (maxfd, &pollset, NULL, NULL, timeout < 0 ? NULL : &tv);
    errno_assert (rc >= 0);
#endif
    revents = 0;
    if ((events & NN_IN) && FD_ISSET (rcvfd, &pollset))
        revents |= NN_IN;
    if ((events & NN_OUT) && FD_ISSET (sndfd, &pollset))
        revents |= NN_OUT;
    return revents;
}